

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSphereShape.cpp
# Opt level: O1

void __thiscall chrono::ChSphereShape::ArchiveIN(ChSphereShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChSphere> specFuncA;
  undefined **local_38;
  ChSphere *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChSphereShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->gsphere;
  local_38 = &PTR__ChFunctorArchiveIn_00b685e8;
  local_28 = "gsphere";
  local_18 = 0;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChSphereShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSphereShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gsphere);
}